

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_namespace::run_impl(statement_namespace *this)

{
  element_type *peVar1;
  _Elt_pointer ppsVar2;
  domain_type *domain;
  _Elt_pointer ppsVar3;
  _Elt_pointer ppsVar4;
  _Map_pointer pppsVar5;
  var local_110;
  scope_guard scope;
  domain_type local_100;
  domain_type local_90;
  
  peVar1 = (((this->super_statement_base).context.
             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  scope_guard::scope_guard(&scope,&(this->super_statement_base).context);
  ppsVar4 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar3 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar5 = (this->mBlock).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppsVar2 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppsVar4 != ppsVar2) {
    statement_base::run(*ppsVar4);
    ppsVar4 = ppsVar4 + 1;
    if (ppsVar4 == ppsVar3) {
      ppsVar4 = pppsVar5[1];
      pppsVar5 = pppsVar5 + 1;
      ppsVar3 = ppsVar4 + 0x40;
    }
  }
  domain = scope_guard::get(&scope);
  domain_type::domain_type(&local_90,domain);
  scope_guard::~scope_guard(&scope);
  std::make_shared<cs::name_space,cs::domain_type>(&local_100);
  make_namespace((cs *)&local_110,(namespace_t *)&local_100);
  domain_manager::add_var_no_return<std::__cxx11::string&>
            (&(peVar1->super_runtime_type).storage,&this->mName,&local_110,true);
  cs_impl::any::recycle(&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_100.m_reflect.
              super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              .
              super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              .slots_);
  domain_type::~domain_type(&local_90);
  return;
}

Assistant:

void statement_namespace::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		context->instance->storage.add_var_no_return(this->mName,
		make_namespace(make_shared_namespace<name_space>([this] {
			scope_guard scope(context);
			for (auto &ptr: mBlock)
			{
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(),
					                ptr->get_raw_code(), e.what());
				}
			}
			return scope.get();
		}())), true);
	}